

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  char cVar2;
  uint8_t uVar3;
  st_ptls_on_extension_t *psVar4;
  ptls_key_exchange_context_t *ppVar5;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar6;
  st_ptls_update_traffic_key_t *psVar7;
  ptls_buffer_t **pppVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ptls_key_exchange_algorithm_t **pppVar14;
  uint8_t *puVar15;
  ushort uVar16;
  uint uVar17;
  ptls_cipher_suite_t **pppVar18;
  ptls_hash_context_t **pppVar19;
  ptls_message_emitter_t *emitter_00;
  ptls_cipher_suite_t *ppVar20;
  uint8_t *puVar21;
  ushort uVar22;
  size_t sVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  ptls_key_schedule_t *ppVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ptls_iovec_t pVar31;
  ptls_iovec_t pVar32;
  ptls_iovec_t message_00;
  ushort local_102;
  ushort local_fa;
  uint8_t *local_e8;
  uint8_t *local_e0;
  size_t local_d8;
  ptls_iovec_t local_c8;
  void *local_b0;
  uint8_t *local_a8;
  byte local_a0 [8];
  uint8_t *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  uint8_t *puStack_50;
  ptls_iovec_t local_48;
  
  puVar15 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  if ((tls->field_0x160 & 0x20) != 0) {
LAB_0011199f:
    iVar10 = server_handle_hello(tls,emitter,message,properties);
    return iVar10;
  }
  uVar17 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xe < uVar17) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x113d,
                  "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar2 = *(char *)&emitter_00->buf;
  message_00.len =
       (ptls_handshake_properties_t *)
       ((long)&switchD_00111826::switchdataD_00124980 +
       (long)(int)(&switchD_00111826::switchdataD_00124980)[uVar17]);
  switch(tls->state) {
  default:
    if (is_end_of_record == 0 || cVar2 != '\x02') {
      return 10;
    }
    local_c8.base = (uint8_t *)0x0;
    local_c8.len = 0;
    local_88 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_48.base = (uint8_t *)0x0;
    iVar10 = 0x32;
    if ((long)puVar15 < 0x26) {
      return 0x32;
    }
    auVar30[0] = -(*(char *)((long)&emitter_00->record_header_length + 6) == -0x3e);
    auVar30[1] = -(*(char *)((long)&emitter_00->record_header_length + 7) == -0x5e);
    auVar30[2] = -(*(char *)&emitter_00->begin_message == '\x11');
    auVar30[3] = -(*(char *)((long)&emitter_00->begin_message + 1) == '\x16');
    auVar30[4] = -(*(char *)((long)&emitter_00->begin_message + 2) == 'z');
    auVar30[5] = -(*(char *)((long)&emitter_00->begin_message + 3) == -0x45);
    auVar30[6] = -(*(char *)((long)&emitter_00->begin_message + 4) == -0x74);
    auVar30[7] = -(*(char *)((long)&emitter_00->begin_message + 5) == '^');
    auVar30[8] = -(*(char *)((long)&emitter_00->begin_message + 6) == '\a');
    auVar30[9] = -(*(char *)((long)&emitter_00->begin_message + 7) == -0x62);
    auVar30[10] = -(*(char *)&emitter_00->commit_message == '\t');
    auVar30[0xb] = -(*(char *)((long)&emitter_00->commit_message + 1) == -0x1e);
    auVar30[0xc] = -(*(char *)((long)&emitter_00->commit_message + 2) == -0x38);
    auVar30[0xd] = -(*(char *)((long)&emitter_00->commit_message + 3) == -0x58);
    auVar30[0xe] = -(*(char *)((long)&emitter_00->commit_message + 4) == '3');
    auVar30[0xf] = -(*(char *)((long)&emitter_00->commit_message + 5) == -100);
    auVar29[0] = -(*(char *)((long)&emitter_00->buf + 6) == -0x31);
    auVar29[1] = -(*(char *)((long)&emitter_00->buf + 7) == '!');
    auVar29[2] = -(*(char *)&emitter_00->enc == -0x53);
    auVar29[3] = -(*(char *)((long)&emitter_00->enc + 1) == 't');
    auVar29[4] = -(*(char *)((long)&emitter_00->enc + 2) == -0x1b);
    auVar29[5] = -(*(char *)((long)&emitter_00->enc + 3) == -0x66);
    auVar29[6] = -(*(char *)((long)&emitter_00->enc + 4) == 'a');
    auVar29[7] = -(*(char *)((long)&emitter_00->enc + 5) == '\x11');
    auVar29[8] = -(*(char *)((long)&emitter_00->enc + 6) == -0x42);
    auVar29[9] = -(*(char *)((long)&emitter_00->enc + 7) == '\x1d');
    auVar29[10] = -((char)emitter_00->record_header_length == -0x74);
    auVar29[0xb] = -(*(char *)((long)&emitter_00->record_header_length + 1) == '\x02');
    auVar29[0xc] = -(*(char *)((long)&emitter_00->record_header_length + 2) == '\x1e');
    auVar29[0xd] = -(*(char *)((long)&emitter_00->record_header_length + 3) == 'e');
    auVar29[0xe] = -(*(char *)((long)&emitter_00->record_header_length + 4) == -0x48);
    auVar29[0xf] = -(*(char *)((long)&emitter_00->record_header_length + 5) == -0x6f);
    auVar29 = auVar29 & auVar30;
    bVar28 = (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
    local_58._1_3_ = 0;
    local_58[0] = bVar28;
    stack0xffffffffffffffac = SUB1612((undefined1  [16])0x0,4);
    if (puVar15 == (uint8_t *)0x26) goto LAB_0011195b;
    bVar9 = *(byte *)((long)&emitter_00->commit_message + 6);
    puVar24 = (uint8_t *)(ulong)bVar9;
    if (puVar15 + -0x27 < puVar24 || (uint8_t *)0x20 < puVar24) goto LAB_0011195b;
    puVar25 = puVar15 + (long)&emitter_00->buf;
    local_68._0_8_ = (long)&emitter_00->commit_message + 7;
    pppVar8 = &emitter_00->buf;
    local_68[8] = bVar9;
    local_68._9_7_ = 0;
    if ((long)puVar25 - (long)(puVar24 + (long)((long)pppVar8 + 0x27)) < 2) goto LAB_0011195b;
    pppVar18 = tls->ctx->cipher_suites;
    ppVar20 = *pppVar18;
    if (ppVar20 != (ptls_cipher_suite_t *)0x0) {
      uVar16 = *(ushort *)(puVar24 + (long)((long)pppVar8 + 0x27));
      do {
        pppVar18 = pppVar18 + 1;
        if (ppVar20->id == (uint16_t)(uVar16 << 8 | uVar16 >> 8)) {
          tls->cipher_suite = ppVar20;
          if ((puVar24 + (long)pppVar8 + 0x29 == puVar25) || (puVar24[(long)pppVar8 + 0x29] != '\0')
             ) goto LAB_00111956;
          if (bVar28) {
            puStack_50._0_2_ = 0xffff;
            puStack_50._2_6_ = 0;
            local_e8 = (uint8_t *)0xffff;
          }
          else {
            local_e8 = (uint8_t *)0x0;
          }
          local_a0[0] = 0x21;
          local_a0[1] = 0x24;
          local_a0[2] = 1;
          local_a0[3] = 0;
          local_a0[4] = 0;
          local_a0[5] = 0x24;
          local_a0[6] = 0;
          local_a0[7] = 0;
          if ((ulong)((long)puVar25 - (long)(puVar24 + (long)pppVar8 + 0x2a)) < 2)
          goto LAB_00111cc7;
          uVar12 = (ulong)(ushort)(*(ushort *)(puVar24 + (long)pppVar8 + 0x2a) << 8 |
                                  *(ushort *)(puVar24 + (long)pppVar8 + 0x2a) >> 8);
          puVar26 = puVar24 + (long)pppVar8 + 0x2c;
          local_98 = puVar25;
          local_b0 = (void *)local_68._0_8_;
          local_a8 = puVar24;
          if ((ulong)((long)puVar25 - (long)puVar26) < uVar12) goto LAB_00111cc7;
          puVar24 = puVar26 + uVar12;
          local_fa = 0xffff;
          local_d8 = 0;
          local_e0 = (uint8_t *)0x0;
          local_102 = 0xffff;
          goto LAB_00111cff;
        }
        ppVar20 = *pppVar18;
      } while (ppVar20 != (ptls_cipher_suite_t *)0x0);
    }
    tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
    goto LAB_00111956;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    iVar10 = 10;
    if (cVar2 == '\b') {
      iVar10 = client_handle_encrypted_extensions(tls,message,properties);
      return iVar10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar2 == '\v') {
LAB_00111b6e:
      iVar10 = client_handle_certificate(tls,message);
      return iVar10;
    }
    if (cVar2 == '\x19') goto LAB_00111c05;
    iVar10 = 10;
    if (cVar2 == '\r') {
      iVar10 = client_handle_certificate_request(tls,message,message_00.len);
      return iVar10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar2 == '\x19') {
LAB_00111c05:
      iVar10 = client_handle_compressed_certificate(tls,message);
      return iVar10;
    }
    iVar10 = 10;
    if (cVar2 == '\v') goto LAB_00111b6e;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar2 != '\x0f') {
      return 10;
    }
    iVar10 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar10 != 0) {
      return iVar10;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
    goto LAB_00111c2b;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    iVar10 = 10;
    if (is_end_of_record != 0 && cVar2 == '\x14') {
      iVar10 = client_handle_finished(tls,emitter,message);
      return iVar10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    iVar10 = 0x28;
    if (is_end_of_record != 0 && cVar2 == '\x01') goto LAB_0011199f;
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    iVar10 = 10;
    if (cVar2 == '\v') {
      iVar10 = server_handle_certificate(tls,message);
      return iVar10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (cVar2 != '\x0f') {
      return 10;
    }
    iVar10 = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
    if (iVar10 != 0) {
      return iVar10;
    }
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
LAB_00111c2b:
    iVar10 = 0x202;
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0x68 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x1117,
                    "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    iVar10 = 10;
    if (cVar2 == '\x05') {
      iVar10 = server_handle_end_of_early_data(tls,message);
      return iVar10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    iVar10 = 0x28;
    if (is_end_of_record != 0 && cVar2 == '\x14') {
      iVar10 = server_handle_finished(tls,message);
      return iVar10;
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar2 == '\x18') {
LAB_00111be6:
      message_00.base = puVar15;
      iVar10 = handle_key_update(tls,emitter_00,message_00);
      return iVar10;
    }
    iVar10 = 10;
    if (cVar2 == '\x04') {
      iVar10 = client_handle_new_session_ticket(tls,message);
      return iVar10;
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    iVar10 = 10;
    if (cVar2 == '\x18') goto LAB_00111be6;
  }
  return iVar10;
LAB_00111cff:
  if (puVar26 == puVar24) {
    local_48.len = local_d8;
    iVar10 = 0x32;
    if (puVar24 != local_98) goto LAB_0011195b;
    lVar13 = 0;
    goto LAB_00111fde;
  }
  if ((long)puVar24 - (long)puVar26 < 2) goto LAB_00111cc7;
  uVar3 = *puVar26;
  bVar9 = puVar26[1];
  uVar16 = CONCAT11(uVar3,bVar9);
  if (uVar16 < 0x40) {
    if ((local_a0[uVar16 >> 3] >> (uVar16 & 7) & 1) != 0) goto LAB_00111956;
    local_a0[bVar9 >> 3] = local_a0[bVar9 >> 3] | '\x01' << (bVar9 & 7);
  }
  if ((ulong)((long)puVar24 - (long)(puVar26 + 2)) < 2) goto LAB_00111cc7;
  uVar16 = *(ushort *)(puVar26 + 2) << 8 | *(ushort *)(puVar26 + 2) >> 8;
  uVar12 = (ulong)uVar16;
  puVar25 = puVar26 + 4;
  if ((ulong)((long)puVar24 - (long)puVar25) < uVar12) goto LAB_00111cc7;
  psVar4 = tls->ctx->on_extension;
  uVar22 = CONCAT11(uVar3,bVar9);
  if ((psVar4 != (st_ptls_on_extension_t *)0x0) &&
     (pVar32.len._0_2_ = uVar16, pVar32.base = puVar25, pVar32.len._2_6_ = 0, local_90 = uVar12,
     iVar10 = (*psVar4->cb)(psVar4,tls,'\x02',uVar22,pVar32), uVar12 = local_90, iVar10 != 0)) {
    iVar10 = 1;
    goto LAB_0011195b;
  }
  puVar25 = puVar25 + uVar12;
  uVar17 = (uint)uVar12;
  puVar21 = puVar25;
  if (uVar22 < 0x2c) {
    if (uVar22 == 0x29) {
      if (bVar28) goto LAB_00111956;
      if (uVar17 < 2) goto LAB_00111cc7;
      local_102 = *(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8;
    }
    else {
      if (uVar22 != 0x2b) goto LAB_00111fa5;
      if (uVar17 < 2) goto LAB_00111cc7;
      local_fa = *(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8;
    }
LAB_00111f9c:
    puVar21 = puVar26 + 6;
  }
  else if (uVar22 == 0x2c) {
    if (!bVar28) goto LAB_00111956;
    if (uVar17 < 2) goto LAB_00111cc7;
    uVar12 = (ulong)(ushort)(*(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8);
    local_e0 = puVar26 + 6;
    if (((ulong)((long)puVar25 - (long)local_e0) <= uVar12 - 1) ||
       (local_48.base = local_e0, puVar26 + uVar12 + 6 != puVar25)) goto LAB_00111cc7;
    local_d8 = (long)(puVar26 + uVar12 + 6) - (long)local_e0;
  }
  else if (uVar22 == 0x33) {
    if (bVar28) {
      if (1 < uVar17) {
        uVar16 = *(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8;
        local_e8 = (uint8_t *)(ulong)uVar16;
        puStack_50._0_2_ = uVar16;
        goto LAB_00111f9c;
      }
      goto LAB_00111cc7;
    }
    if ((uVar17 < 2) || (puVar25 + (-6 - (long)puVar26) < (uint8_t *)0x2)) goto LAB_00111cc7;
    local_e8 = puVar26 + 8;
    local_e0 = (uint8_t *)
               (ulong)(ushort)(*(ushort *)(puVar26 + 6) << 8 | *(ushort *)(puVar26 + 6) >> 8);
    if (puVar25 + -(long)local_e8 < local_e0) goto LAB_00111cc7;
    puStack_50 = local_e8;
    local_48.base = local_e0;
    if (local_e8 + (long)local_e0 != puVar25) goto LAB_00111cc7;
    iVar10 = 0x2f;
    if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
       (tls->key_share->id !=
        (uint16_t)(*(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8)))
    goto LAB_0011195b;
  }
LAB_00111fa5:
  puVar26 = puVar25;
  if (puVar21 != puVar25) goto LAB_00111cc7;
  goto LAB_00111cff;
LAB_00111cc7:
  iVar10 = 0x32;
  goto LAB_0011195b;
  while (lVar13 = lVar13 + 2, lVar13 != 8) {
LAB_00111fde:
    if (*(ushort *)((long)supported_versions + lVar13) == local_fa) {
      if (bVar28) {
LAB_00112043:
        if ((int)local_a8 != 0x20) break;
        iVar11 = (*ptls_mem_equal)(local_b0,&tls->field_20,0x20);
        iVar10 = 0x2f;
        if (iVar11 == 0) goto LAB_0011195b;
        if (bVar28) {
          iVar10 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
          if (iVar10 == 0) {
            ppVar5 = (tls->field_20).client.key_share_ctx;
            if (ppVar5 != (ptls_key_exchange_context_t *)0x0) {
              pppVar1 = &(tls->field_20).client.key_share_ctx;
              (*ppVar5->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
              *pppVar1 = (ptls_key_exchange_context_t *)0x0;
            }
            bVar9 = (tls->field_20).server.pending_traffic_secret[0x28];
            if ((bVar9 & 2) != 0) {
              if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
                __ptr = (tls->traffic_protection).enc.aead;
                if (__ptr == (st_ptls_aead_context_t *)0x0) {
                  __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                ,0x892,
                                "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                               );
                }
                (*__ptr->dispose_crypto)(__ptr);
                (*ptls_clear_memory)(__ptr->static_iv,__ptr->algo->iv_size);
                free(__ptr);
                (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                bVar9 = (tls->field_20).server.pending_traffic_secret[0x28];
              }
              (tls->field_20).server.pending_traffic_secret[0x28] = bVar9 & 0xfd;
            }
            if ((uint16_t)local_e8 == 0xffff) {
              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                return 0x2f;
              }
            }
            else {
              pppVar14 = tls->ctx->key_exchanges;
              ppVar6 = *pppVar14;
              while( true ) {
                if (ppVar6 == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
                pppVar14 = pppVar14 + 1;
                if (ppVar6->id == (uint16_t)local_e8) break;
                ppVar6 = *pppVar14;
              }
              tls->key_share = ppVar6;
            }
            key_schedule_transform_post_ch1hash(tls->key_schedule);
            ppVar27 = tls->key_schedule;
            if (ppVar27->num_hashes != 0) {
              pppVar19 = &ppVar27->hashes[0].ctx;
              sVar23 = 0;
              do {
                (*(*pppVar19)->update)(*pppVar19,emitter_00,(size_t)puVar15);
                sVar23 = sVar23 + 1;
                pppVar19 = pppVar19 + 2;
              } while (sVar23 != ppVar27->num_hashes);
            }
            iVar10 = send_client_hello(tls,emitter,properties,&local_48);
            return iVar10;
          }
          goto LAB_0011195b;
        }
      }
      else {
        if (local_102 != 0xffff) {
          if ((local_102 != 0) || (((tls->field_20).server.pending_traffic_secret[0x28] & 1) == 0))
          break;
          tls->field_0x160 = tls->field_0x160 | 2;
        }
        local_e8._0_2_ = local_58._8_2_;
        if (puStack_50 != (uint8_t *)0x0) goto LAB_00112043;
        if (((int)local_a8 != 0x20) || ((tls->field_0x160 & 2) == 0)) break;
        iVar11 = (*ptls_mem_equal)(local_b0,&tls->field_20,0x20);
        iVar10 = 0x2f;
        if (iVar11 == 0) goto LAB_0011195b;
      }
      uVar17 = 0;
      if (((tls->field_20).server.pending_traffic_secret[0x28] & 1) != 0) {
        uVar17 = (uint)((tls->field_0x160 & 2) == 0);
      }
      iVar10 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar17);
      if ((iVar10 == 0) &&
         ((puStack_50 == (uint8_t *)0x0 ||
          (pVar31.len = (size_t)local_e0, pVar31.base = puStack_50,
          iVar10 = (*((tls->field_20).client.key_share_ctx)->on_exchange)
                             (&(tls->field_20).client.key_share_ctx,1,&local_c8,pVar31), iVar10 == 0
          )))) {
        ppVar27 = tls->key_schedule;
        if (ppVar27->num_hashes != 0) {
          pppVar19 = &ppVar27->hashes[0].ctx;
          sVar23 = 0;
          do {
            (*(*pppVar19)->update)(*pppVar19,emitter_00,(size_t)puVar15);
            sVar23 = sVar23 + 1;
            pppVar19 = pppVar19 + 2;
          } while (sVar23 != ppVar27->num_hashes);
          ppVar27 = tls->key_schedule;
        }
        iVar10 = key_schedule_extract(ppVar27,local_c8);
        if ((iVar10 != 0) ||
           (iVar10 = setup_traffic_protection(tls,0,"s hs traffic",2,0), iVar10 != 0))
        goto LAB_0011195b;
        if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
          iVar10 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_001122a6:
          if (iVar10 != 0) goto LAB_0011195b;
        }
        else {
          puVar15 = (uint8_t *)malloc(0x40);
          tls->pending_handshake_secret = puVar15;
          if (puVar15 == (uint8_t *)0x0) {
            iVar10 = 0x201;
            goto LAB_0011195b;
          }
          iVar10 = derive_secret(tls->key_schedule,puVar15,"c hs traffic");
          if (iVar10 != 0) goto LAB_0011195b;
          psVar7 = tls->ctx->update_traffic_key;
          if (psVar7 != (st_ptls_update_traffic_key_t *)0x0) {
            iVar10 = (*psVar7->cb)(psVar7,tls,1,2,tls->pending_handshake_secret);
            goto LAB_001122a6;
          }
        }
        tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
        iVar10 = 0x202;
      }
      goto LAB_0011195b;
    }
  }
LAB_00111956:
  iVar10 = 0x2f;
LAB_0011195b:
  if (local_c8.base == (uint8_t *)0x0) {
    return iVar10;
  }
  (*ptls_clear_memory)(local_c8.base,local_c8.len);
  free(local_c8.base);
  return iVar10;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                    ptls_handshake_properties_t *properties)
{
    int ret;
    if (tls->in_handshake)
        return(server_handle_hello(tls, emitter, message, properties));
    uint8_t type = message.base[0];

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}